

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstr.cpp
# Opt level: O1

LPWSTR lstrcpynW(LPWSTR lpString1,LPCWSTR lpString2,int iMaxLength)

{
  WCHAR WVar1;
  bool bVar2;
  LPWSTR pWVar3;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (lpString2 == (LPCWSTR)0x0 || lpString1 == (LPWSTR)0x0) {
    lpString1 = (LPWSTR)0x0;
  }
  else {
    pWVar3 = lpString1;
    if (1 < iMaxLength) {
      do {
        WVar1 = *lpString2;
        if (WVar1 == L'\0') goto LAB_00145c50;
        lpString2 = lpString2 + 1;
        *pWVar3 = WVar1;
        pWVar3 = pWVar3 + 1;
        bVar2 = 2 < iMaxLength;
        iMaxLength = iMaxLength + -1;
      } while (bVar2);
      iMaxLength = 1;
    }
LAB_00145c50:
    if (0 < iMaxLength) {
      *pWVar3 = L'\0';
    }
  }
  return lpString1;
}

Assistant:

LPWSTR
PALAPI
lstrcpynW(
	  OUT LPWSTR lpString1,
	  IN LPCWSTR lpString2,
	  IN int iMaxLength)
{
    LPWSTR lpStart = lpString1;

    PERF_ENTRY(lstrcpynW);
    ENTRY("lstrcpynW (lpString1=%p, lpString2=%p (%S), iMaxLength=%d)\n",
              lpString1?lpString1:W16_NULLSTRING, lpString2?lpString2:W16_NULLSTRING, lpString2?lpString2:W16_NULLSTRING, iMaxLength);

    if (lpString1 == NULL)
    {
        ERROR("invalid lpString1 argument\n");
        LOGEXIT("lstrcpynW returning LPWSTR NULL\n");
        PERF_EXIT(lstrcpynW);
        return NULL;
    }

    if (lpString2 == NULL)
    {
        ERROR("invalid lpString2 argument\n");
        LOGEXIT("lstrcpynW returning LPWSTR NULL\n");
        PERF_EXIT(lstrcpynW);
        return NULL;
    }

    /* copy source string to destination string */
    while(iMaxLength > 1 && *lpString2)
    {
        *lpString1++ = *lpString2++;
        iMaxLength--;
    }

    /* add terminating null */
    if (iMaxLength > 0)
    {
        *lpString1 = '\0';
    }

    LOGEXIT("lstrcpynW returning LPWSTR %p (%S)\n", lpStart, lpStart);
    PERF_EXIT(lstrcpynW);
    return lpStart;

}